

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O3

void set_reference_points<IsoForest,double,unsigned_long>
               (TreesIndexer *indexer,IsoForest *model,bool with_distances,double *numeric_data,
               int *categ_data,bool is_col_major,size_t ld_numeric,size_t ld_categ,double *Xc,
               unsigned_long *Xc_ind,unsigned_long *Xc_indptr,double *Xr,unsigned_long *Xr_ind,
               unsigned_long *Xr_indptr,size_t nrows,int nthreads)

{
  pointer pSVar1;
  pointer puVar2;
  long lVar3;
  iterator __begin2;
  pointer pSVar4;
  double *output_depths;
  ulong uVar5;
  unsigned_long *tree_num;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  long lVar6;
  pointer __old_p;
  unsigned_long *puVar7;
  long lVar8;
  
  pSVar4 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar4 == (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
     ((with_distances &&
      ((pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pSVar4->node_distances).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    build_tree_indices(indexer,model,nthreads,with_distances);
    pSVar4 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if ((pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pSVar1 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      puVar2 = (pSVar4->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
      puVar2 = (pSVar4->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar4->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (pSVar4->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
    }
  }
  lVar8 = ((long)(model->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  output_depths = (double *)operator_new__(-(ulong)(nrows >> 0x3d != 0) | nrows * 8);
  uVar5 = lVar8 * nrows;
  tree_num = (unsigned_long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  predict_iforest<double,unsigned_long>
            (numeric_data,categ_data,is_col_major,ld_numeric,ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,
             Xr_indptr,nrows,nthreads,false,model,(ExtIsoForest *)0x0,output_depths,tree_num,
             (double *)0x0,indexer);
  operator_delete__(output_depths);
  lVar8 = lVar8 + 1;
  lVar6 = 0x48;
  puVar7 = tree_num;
  while (lVar8 = lVar8 + -1, lVar8 != 0) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_assign_aux<unsigned_long*>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)
               ((long)&(((indexer->indices).
                         super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
                         _M_impl.super__Vector_impl_data._M_start)->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar6),
               puVar7,puVar7 + nrows);
    pSVar4 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(long *)((long)&(pSVar4->terminal_node_mappings).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                 lVar6 + 0x10) !=
        *(long *)((long)&(pSVar4->terminal_node_mappings).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                 lVar6 + 8)) {
      std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
      _S_do_it((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(pSVar4->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar6));
      pSVar4 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    puVar7 = puVar7 + nrows;
    lVar3 = lVar6 + -0x48;
    lVar6 = lVar6 + 0x98;
    build_ref_node((SingleTreeIndex *)((long)pSVar4 + lVar3));
  }
  operator_delete__(tree_num);
  return;
}

Assistant:

void set_reference_points(TreesIndexer &indexer, Model &model, const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    if (indexer.indices.empty() || (with_distances && indexer.indices.front().node_distances.empty()))
    {
        build_tree_indices(indexer, model, nthreads, with_distances);
    }

    if (!indexer.indices.front().reference_points.empty())
    {
        for (auto &tree : indexer.indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }
    }


    size_t ntrees = get_ntrees(model);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    std::unique_ptr<sparse_ix[]> node_indices_predict(new sparse_ix[nrows * ntrees]);
    void *model_ptr = (std::is_same<Model, IsoForest>::value)? &model : NULL;
    void *model_ext_ptr = (std::is_same<Model, ExtIsoForest>::value)? &model : NULL;
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    Xc, Xc_ind, Xc_indptr,
                    Xr, Xr_ind, Xr_indptr,
                    nrows, nthreads, false,
                    (IsoForest*)model_ptr, (ExtIsoForest*)model_ext_ptr,
                    ignored.get(), node_indices_predict.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) \
            shared(indexer, node_indices_predict, ntrees)
    for (size_t_for tree = 0; tree < (decltype(tree))ntrees; tree++)
    {
        indexer.indices[tree].reference_points.assign(node_indices_predict.get() + tree*nrows,
                                                      node_indices_predict.get() + (tree+1)*nrows);
        indexer.indices[tree].reference_points.shrink_to_fit();
        build_ref_node(indexer.indices[tree]);
    }
}